

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

ActionResultHolder<std::optional<n_e_s::core::Pixel>_> *
testing::internal::ActionResultHolder<std::optional<n_e_s::core::Pixel>>::
PerformAction<std::optional<n_e_s::core::Pixel>()>
          (Action<std::optional<n_e_s::core::Pixel>_()> *action,ArgumentTuple *args)

{
  Result value;
  ActionResultHolder<std::optional<n_e_s::core::Pixel>_> *this;
  Wrapper result;
  undefined1 local_1e [6];
  ArgumentTuple *local_18;
  ArgumentTuple *args_local;
  Action<std::optional<n_e_s::core::Pixel>_()> *action_local;
  
  local_18 = args;
  args_local = (ArgumentTuple *)action;
  this = (ActionResultHolder<std::optional<n_e_s::core::Pixel>_> *)operator_new(0x10);
  value = Action<std::optional<n_e_s::core::Pixel>_()>::Perform
                    ((Action<std::optional<n_e_s::core::Pixel>_()> *)args_local);
  ReferenceOrValueWrapper<std::optional<n_e_s::core::Pixel>_>::ReferenceOrValueWrapper
            ((ReferenceOrValueWrapper<std::optional<n_e_s::core::Pixel>_> *)local_1e,
             (optional<n_e_s::core::Pixel>)
             value.super__Optional_base<n_e_s::core::Pixel,_true,_true>._M_payload.
             super__Optional_payload_base<n_e_s::core::Pixel>);
  result.value_.super__Optional_base<n_e_s::core::Pixel,_true,_true>._M_payload.
  super__Optional_payload_base<n_e_s::core::Pixel>._4_2_ = local_1e._4_2_;
  result.value_.super__Optional_base<n_e_s::core::Pixel,_true,_true>._M_payload.
  super__Optional_payload_base<n_e_s::core::Pixel>._M_payload._0_4_ = local_1e._0_4_;
  ActionResultHolder<std::optional<n_e_s::core::Pixel>_>::ActionResultHolder(this,result);
  return this;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }